

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

int anon_unknown.dwarf_3d9::ToolTargetsList
              (vector<Node_*,_std::allocator<Node_*>_> *nodes,int depth,int indent)

{
  char *__s;
  Edge *pEVar1;
  int iVar2;
  int iVar3;
  pointer ppNVar4;
  int iVar5;
  bool bVar6;
  
  ppNVar4 = (nodes->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar3 = 0;
  iVar2 = indent;
  if (indent < 1) {
    iVar2 = iVar3;
  }
  for (; iVar5 = iVar2,
      ppNVar4 !=
      (nodes->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish; ppNVar4 = ppNVar4 + 1) {
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      printf("  ");
    }
    __s = ((*ppNVar4)->path_)._M_dataplus._M_p;
    pEVar1 = (*ppNVar4)->in_edge_;
    if (pEVar1 == (Edge *)0x0) {
      iVar3 = puts(__s);
    }
    else {
      iVar3 = printf("%s: %s\n",__s,(pEVar1->rule_->name_)._M_dataplus._M_p);
      if (depth != 1) {
        iVar3 = ToolTargetsList(&(*ppNVar4)->in_edge_->inputs_,depth + -1,indent + 1);
      }
    }
  }
  return iVar3;
}

Assistant:

int ToolTargetsList(const vector<Node*>& nodes, int depth, int indent) {
  for (vector<Node*>::const_iterator n = nodes.begin();
       n != nodes.end();
       ++n) {
    for (int i = 0; i < indent; ++i)
      printf("  ");
    const char* target = (*n)->path().c_str();
    if ((*n)->in_edge()) {
      printf("%s: %s\n", target, (*n)->in_edge()->rule_->name().c_str());
      if (depth > 1 || depth <= 0)
        ToolTargetsList((*n)->in_edge()->inputs_, depth - 1, indent + 1);
    } else {
      printf("%s\n", target);
    }
  }
  return 0;
}